

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineArguments_checkContinuousIntegrationMode_Test::
TEST_CommandLineArguments_checkContinuousIntegrationMode_Test
          (TEST_CommandLineArguments_checkContinuousIntegrationMode_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args = (CommandLineArguments *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).plugin = (OptionsPlugin *)0x0;
  TEST_GROUP_CppUTestGroupCommandLineArguments::TEST_GROUP_CppUTestGroupCommandLineArguments
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_003444c8;
  return;
}

Assistant:

TEST(CommandLineArguments, checkContinuousIntegrationMode)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-ci" };
    CHECK(newArgumentParser(argc, argv));
    CHECK(!args->isVerbose());
    LONGS_EQUAL(1, args->getRepeatCount());
    CHECK(NULLPTR == args->getGroupFilters());
    CHECK(NULLPTR == args->getNameFilters());
    CHECK(args->isEclipseOutput());
    CHECK(SimpleString("") == args->getPackageName());
    CHECK(!args->isCrashingOnFail());
    CHECK_FALSE(args->isRethrowingExceptions());
}